

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::UserGeometryISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRef> *prims,
          size_t itime,range<unsigned_long> *r,size_t k,uint geomID)

{
  PrimRef *pPVar1;
  undefined1 auVar2 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined4 uVar6;
  float fVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  BBox3fa box [2];
  size_t local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  void *local_c0;
  float local_b8;
  int local_b4;
  float *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  PrimInfo *local_88;
  mvector<PrimRef> *local_80;
  undefined1 local_78 [32];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  local_98 = _DAT_01feba00;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_98;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar8 = r->_begin;
  local_f0 = __return_storage_ptr__->end;
  local_a8._8_4_ = 0x7f800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  local_a8._12_4_ = 0x7f800000;
  local_88 = __return_storage_ptr__;
  if (uVar8 < r->_end) {
    local_e8._8_4_ = 0x7f800000;
    local_e8._0_8_ = 0x7f8000007f800000;
    local_e8._12_4_ = 0x7f800000;
    local_d8 = local_98;
    local_80 = prims;
    do {
      local_c0 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      fVar7 = (float)uVar8;
      local_b0 = (float *)local_78;
      local_b8 = fVar7;
      local_b4 = (int)itime;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_c0);
      local_b0 = &local_58;
      local_b4 = (int)itime + 1;
      uVar6 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                        (&local_c0);
      fVar9 = local_78._0_4_;
      fVar10 = local_78._4_4_;
      fVar11 = local_78._8_4_;
      fVar12 = local_78._16_4_;
      fVar13 = local_78._20_4_;
      fVar14 = local_78._24_4_;
      auVar15._0_4_ = -(uint)((-1.844e+18 < fVar9 && fVar12 < 1.844e+18) && fVar9 <= fVar12);
      auVar15._4_4_ = -(uint)((-1.844e+18 < fVar10 && fVar13 < 1.844e+18) && fVar10 <= fVar13);
      auVar15._8_4_ = -(uint)((-1.844e+18 < fVar11 && fVar14 < 1.844e+18) && fVar11 <= fVar14);
      auVar15._12_4_ =
           -(uint)((-1.844e+18 < local_78._12_4_ && local_78._28_4_ < 1.844e+18) &&
                  local_78._12_4_ <= local_78._28_4_);
      uVar6 = movmskps(uVar6,auVar15);
      if (((~(byte)uVar6 & 7) == 0) &&
         (auVar17._0_4_ =
               -(uint)((local_48 < 1.844e+18 && -1.844e+18 < local_58) && local_58 <= local_48),
         auVar17._4_4_ =
              -(uint)((fStack_44 < 1.844e+18 && -1.844e+18 < fStack_54) && fStack_54 <= fStack_44),
         auVar17._8_4_ =
              -(uint)((fStack_40 < 1.844e+18 && -1.844e+18 < fStack_50) && fStack_50 <= fStack_40),
         auVar17._12_4_ =
              -(uint)((fStack_3c < 1.844e+18 && -1.844e+18 < fStack_4c) && fStack_4c <= fStack_3c),
         uVar6 = movmskps(CONCAT31((int3)((uint)uVar6 >> 8),~(byte)uVar6),auVar17),
         (~(byte)uVar6 & 7) == 0)) {
        auVar2._12_4_ = geomID;
        auVar2._0_12_ = local_78._0_12_;
        local_a8 = minps(local_a8,auVar2);
        auVar4._12_4_ = fVar7;
        auVar4._0_12_ = local_78._16_12_;
        local_98 = maxps(local_98,auVar4);
        auVar16._0_4_ = fVar9 + fVar12;
        auVar16._4_4_ = fVar10 + fVar13;
        auVar16._8_4_ = fVar11 + fVar14;
        auVar16._12_4_ = (float)geomID + fVar7;
        local_e8 = minps(local_e8,auVar16);
        local_d8 = maxps(local_d8,auVar16);
        local_f0 = local_f0 + 1;
        pPVar1 = local_80->items;
        aVar3.m128[3] = (float)geomID;
        aVar3._0_12_ = local_78._0_12_;
        pPVar1[k].lower.field_0 = aVar3;
        aVar5.m128[3] = fVar7;
        aVar5._0_12_ = local_78._16_12_;
        pPVar1[k].upper.field_0 = aVar5;
        k = k + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < r->_end);
  }
  else {
    local_d8 = local_98;
    local_e8._8_4_ = 0x7f800000;
    local_e8._0_8_ = 0x7f8000007f800000;
    local_e8._12_4_ = 0x7f800000;
  }
  *(undefined8 *)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8) =
       local_a8._8_8_;
  *(undefined1 (*) [16])
   (local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.m128 =
       local_98;
  *(undefined8 *)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_e8._0_8_;
  *(undefined8 *)
   ((long)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8) =
       local_e8._8_8_;
  *(undefined8 *)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_d8._0_8_;
  *(undefined8 *)
   ((long)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 + 8) =
       local_d8._8_8_;
  local_88->end = local_f0;
  return local_88;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }